

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chip8.cpp
# Opt level: O0

void __thiscall Chip8::Chip8::~Chip8(Chip8 *this)

{
  Chip8 *this_local;
  
  SDL_Quit();
  std::unique_ptr<Chip8::Audio,_std::default_delete<Chip8::Audio>_>::~unique_ptr(&this->_audio);
  std::unique_ptr<Chip8::CPU,_std::default_delete<Chip8::CPU>_>::~unique_ptr(&this->_cpu);
  std::unique_ptr<Chip8::Memory,_std::default_delete<Chip8::Memory>_>::~unique_ptr(&this->_memory);
  std::unique_ptr<Chip8::Graphics,_std::default_delete<Chip8::Graphics>_>::~unique_ptr
            (&this->_graphics);
  return;
}

Assistant:

Chip8::~Chip8() {
        SDL_Quit();
    }